

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Object * __thiscall ICM::Interpreter::getObject(Interpreter *this,Element *element)

{
  uint8_t uVar1;
  ElementPool *EP;
  Object *pOVar2;
  Object OVar3;
  
  uVar1 = (element->field_0).field_0.etype;
  if (uVar1 != '\x03') {
    if (uVar1 == '\x02') {
      pOVar2 = (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start[element->index];
    }
    else if (uVar1 == '\x01') {
      EP = this->EP;
      pOVar2 = (Object *)operator_new(0x10);
      OVar3 = getLiteral(element,EP);
      *pOVar2 = OVar3;
    }
    else {
      pOVar2 = (Object *)0x0;
      printf("%s","Error in getObject.");
      putchar(10);
    }
    return pOVar2;
  }
  pOVar2 = getIdentData(element);
  return pOVar2;
}

Assistant:

Object* getObject(const Instruction::Element &element) {
			if (element.isLiteral()) {
				return createObjectFromLiteral(element, EP);
			}
			else if (element.isRefer()) {
				return TempResult[element.getRefer()];
			}
			else if (element.isIdent()) {
				return getIdentData(element);
			}
			else {
				println("Error in getObject.");
				return nullptr;
			}
		}